

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O1

void __thiscall JsonArray_TwoElements_Test::TestBody(JsonArray_TwoElements_Test *this)

{
  StrictMock<mock_json_callbacks> *this_00;
  FunctionMocker<std::error_code_()> *pFVar1;
  undefined1 auVar2 [8];
  TypedExpectation<std::error_code_()> *pTVar3;
  TypedExpectation<std::error_code_(unsigned_long)> *this_01;
  TypedExpectation<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_02;
  pointer *__ptr;
  char *message;
  char *in_R9;
  pointer *__ptr_2;
  AssertionResult gtest_ar;
  InSequence _;
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  coord local_f8;
  undefined1 local_f0 [8];
  VTable *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  undefined1 local_d0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  AssertHelper local_c0;
  undefined1 local_b8 [8];
  deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
  local_b0;
  int local_60;
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  coord local_20;
  
  testing::InSequence::InSequence((InSequence *)local_d0);
  this_00 = &(this->super_JsonArray).callbacks_;
  pFVar1 = &(this->super_JsonArray).callbacks_.super_mock_json_callbacks.gmock00_begin_array_50;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&pFVar1->super_UntypedFunctionMockerBase,this_00);
  local_b8 = (undefined1  [8])pFVar1;
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                     ((MockSpec<std::error_code_()> *)local_b8,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
                      ,0x87,"callbacks_","begin_array ()");
  testing::internal::TypedExpectation<std::error_code_()>::Times(pTVar3,1);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)local_f0,1);
  mock_json_callbacks::gmock_uint64_value
            ((MockSpec<std::error_code_(unsigned_long)> *)local_b8,
             &this_00->super_mock_json_callbacks,(Matcher<unsigned_long> *)local_f0);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<std::error_code_(unsigned_long)>::InternalExpectedAt
                      ((MockSpec<std::error_code_(unsigned_long)> *)local_b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
                       ,0x88,"callbacks_","uint64_value (1)");
  testing::internal::TypedExpectation<std::error_code_(unsigned_long)>::Times(this_01,1);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&local_b0);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)local_f0);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *)local_f0,"hello");
  mock_json_callbacks::gmock_string_value
            ((MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)local_b8,&this_00->super_mock_json_callbacks,
             (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)local_f0);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::
            MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::InternalExpectedAt
                      ((MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)local_b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
                       ,0x89,"callbacks_","string_value (\"hello\")");
  testing::internal::
  TypedExpectation<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::Times(this_02,1);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&local_b0);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)local_f0);
  pFVar1 = &(this->super_JsonArray).callbacks_.super_mock_json_callbacks.gmock00_end_array_51;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&pFVar1->super_UntypedFunctionMockerBase,this_00);
  local_b8 = (undefined1  [8])pFVar1;
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                     ((MockSpec<std::error_code_()> *)local_b8,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
                      ,0x8a,"callbacks_","end_array ()");
  testing::internal::TypedExpectation<std::error_code_()>::Times(pTVar3,1);
  testing::InSequence::~InSequence((InSequence *)local_d0);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::parser
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_b8,
             (this->super_JsonArray).proxy_.original_,none);
  local_f0 = (undefined1  [8])&local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"[ 1 ,\n \"hello\" ]","");
  auVar2 = local_f0;
  pstore::gsl::details::extent_type<-1L>::extent_type
            ((extent_type<_1L> *)local_d0,(index_type)local_e8);
  local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)auVar2;
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>>::
  input<pstore::gsl::span<char_const,_1l>>
            ((parser<callbacks_proxy<mock_json_callbacks>> *)local_b8,
             (span<const_char,__1L> *)local_d0);
  if (local_f0 != (undefined1  [8])&local_e0) {
    operator_delete((void *)local_f0,local_e0._M_allocated_capacity + 1);
  }
  local_d0[0] = local_60 == 0;
  local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
  if (local_60 != 0) {
    testing::Message::Message((Message *)&local_f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_f8 + 0x10),"Expected the parse error to be zero",0x23);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f0,(internal *)local_d0,(AssertionResult *)"p.last_error ()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0x8e,(char *)local_f0);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_f0 != (undefined1  [8])&local_e0) {
      operator_delete((void *)local_f0,local_e0._M_allocated_capacity + 1);
    }
    if (local_f8 != (coord)0x0) {
      (**(code **)(*(long *)local_f8 + 8))();
    }
  }
  if (local_c8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
  }
  local_d0._0_4_ = local_20.column;
  local_d0._4_4_ = local_20.row;
  local_f8.column = 0xb;
  local_f8.row = 2;
  testing::internal::CmpHelperEQ<pstore::json::coord,pstore::json::coord>
            ((internal *)local_f0,"p.coordinate ()","(json::coord{11U, 2U})",(coord *)local_d0,
             &local_f8);
  if (local_f0[0] == (string)0x0) {
    testing::Message::Message((Message *)local_d0);
    if (local_e8 == (VTable *)0x0) {
      message = "";
    }
    else {
      message = ((_Alloc_hider *)&local_e8->match_and_explain)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0x8f,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if ((coord)local_d0 != (coord)0x0) {
      (**(code **)(*(long *)local_d0 + 8))();
    }
  }
  if (local_e8 != (VTable *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
  ::~deque(&local_b0);
  if ((_Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
       )local_b8 != (singleton_storage<callbacks_proxy<mock_json_callbacks>_> *)0x0) {
    operator_delete((void *)local_b8,0x68);
  }
  return;
}

Assistant:

TEST_F (JsonArray, TwoElements) {
    {
        ::testing::InSequence _;
        EXPECT_CALL (callbacks_, begin_array ()).Times (1);
        EXPECT_CALL (callbacks_, uint64_value (1)).Times (1);
        EXPECT_CALL (callbacks_, string_value ("hello")).Times (1);
        EXPECT_CALL (callbacks_, end_array ()).Times (1);
    }
    auto p = json::make_parser (proxy_);
    p.input (std::string{"[ 1 ,\n \"hello\" ]"});
    EXPECT_FALSE (p.last_error ()) << "Expected the parse error to be zero";
    EXPECT_EQ (p.coordinate (), (json::coord{11U, 2U}));
}